

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O1

void __thiscall cppcms::plugin::scope::~scope(scope *this)

{
  _Base_ptr p_Var1;
  _data *p_Var2;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar3;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> local_28;
  
  class_data();
  local_28._M_device = &class_data::d.lock;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  p_Var2 = (this->d).ptr_;
  p_Var1 = (p_Var2->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var1 != &(p_Var2->objects)._M_t._M_impl.super__Rb_tree_header) {
    do {
      pVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::equal_range(&class_data::d.modules._M_t,(key_type *)(p_Var1 + 1));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_aux(&class_data::d.modules._M_t,(_Base_ptr)pVar3.first._M_node,
                     (_Base_ptr)pVar3.second._M_node);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
      p_Var2 = (this->d).ptr_;
    } while ((_Rb_tree_header *)p_Var1 != &(p_Var2->objects)._M_t._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>_>_>
  ::clear(&(p_Var2->objects)._M_t);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  booster::hold_ptr<cppcms::plugin::scope::_data>::~hold_ptr(&this->d);
  return;
}

Assistant:

scope::~scope() 
{
	try {
		_class_data &cls = class_data();
		booster::unique_lock<booster::mutex> guard(cls.lock);
		for(std::map<std::string,booster::shared_ptr<booster::shared_object> >::iterator p=d->objects.begin();p!=d->objects.end();++p) {
			cls.modules.erase(p->first);
		}
		d->objects.clear();
	}
	catch(...) {}
}